

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O0

UINT8 DROPlayer::PlayerCanLoadFile(DATA_LOADER *dataLoader)

{
  UINT32 UVar1;
  long *plVar2;
  DATA_LOADER *dataLoader_local;
  
  DataLoader_ReadUntil(dataLoader,0x10);
  UVar1 = DataLoader_GetSize(dataLoader);
  if (UVar1 < 0x10) {
    dataLoader_local._7_1_ = 0xf1;
  }
  else {
    plVar2 = (long *)DataLoader_GetData(dataLoader);
    if (*plVar2 == 0x4c504f5741524244) {
      dataLoader_local._7_1_ = '\0';
    }
    else {
      dataLoader_local._7_1_ = 0xf0;
    }
  }
  return dataLoader_local._7_1_;
}

Assistant:

UINT8 DROPlayer::PlayerCanLoadFile(DATA_LOADER *dataLoader)
{
	DataLoader_ReadUntil(dataLoader,0x10);
	if (DataLoader_GetSize(dataLoader) < 0x10)
		return 0xF1;	// file too small
	if (memcmp(&DataLoader_GetData(dataLoader)[0x00], "DBRAWOPL", 8))
		return 0xF0;	// invalid signature
	return 0x00;
}